

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestAds::testAdsNotification(TestAds *this,string *param_1)

{
  long lVar1;
  ostream *poVar2;
  bool bVar3;
  test_root local_1208;
  test_root local_11e8;
  int local_11c4;
  duration<long,_std::ratio<1L,_1000L>_> local_11c0;
  test_root local_11b8;
  test_root local_1198;
  test_root local_1178;
  test_root local_1158;
  test_root local_1138;
  test_root local_1118;
  test_root local_10f8;
  test_root local_10d8;
  AmsNetId local_10b8 [6];
  undefined2 local_10b2;
  AmsAddr unknown;
  test_root local_1090;
  uint local_106c;
  undefined1 auStack_1068 [4];
  uint32_t hUser;
  AdsNotificationAttrib attrib;
  uint32_t notification [1024];
  test_root local_40;
  long local_20;
  long port;
  string *param_3_local;
  TestAds *this_local;
  
  port = (long)param_1;
  param_3_local = (string *)this;
  local_20 = AdsPortOpenEx();
  bVar3 = local_20 != 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_40);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_40,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x2cf);
  std::__cxx11::string::~string((string *)&local_40);
  auStack_1068 = (undefined1  [4])0x1;
  hUser = 3;
  attrib.cbLength = 0;
  attrib.nTransMode = 1000000;
  local_106c = 0xdeadbeef;
  lVar1 = AdsSyncAddDeviceNotificationReqEx
                    (0,(AmsAddr *)&server,0x4020,0,(AdsNotificationAttrib *)auStack_1068,
                     NotifyCallback,0xdeadbeef,&attrib.nMaxDelay);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1090);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x748,(string *)&local_1090,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncAddDeviceNotificationReqEx(0, &server, 0x4020, 0, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2da);
  std::__cxx11::string::~string((string *)&local_1090);
  lVar1 = AdsSyncAddDeviceNotificationReqEx
                    (local_20,(AmsAddr *)0x0,0x4020,0,(AdsNotificationAttrib *)auStack_1068,
                     NotifyCallback,local_106c,&attrib.nMaxDelay);
  fructose::test_root::get_test_name_abi_cxx11_((test_root *)&unknown);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x749,(string *)&unknown,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncAddDeviceNotificationReqEx(port, nullptr, 0x4020, 0, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2df);
  std::__cxx11::string::~string((string *)&unknown);
  AmsNetId::AmsNetId(local_10b8,'\x01','\x02','\x03','\x04','\x05','\x06');
  local_10b2 = 0x353;
  lVar1 = AdsSyncAddDeviceNotificationReqEx
                    (local_20,(AmsAddr *)local_10b8,0x4020,0,(AdsNotificationAttrib *)auStack_1068,
                     NotifyCallback,local_106c,&attrib.nMaxDelay);
  fructose::test_root::get_test_name_abi_cxx11_(&local_10d8);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 7,(string *)&local_10d8,
             "GLOBALERR_MISSING_ROUTE == AdsSyncAddDeviceNotificationReqEx(port, &unknown, 0x4020, 0, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2e5);
  std::__cxx11::string::~string((string *)&local_10d8);
  lVar1 = AdsSyncAddDeviceNotificationReqEx
                    (local_20,(AmsAddr *)&server,0,0,(AdsNotificationAttrib *)auStack_1068,
                     NotifyCallback,local_106c,&attrib.nMaxDelay);
  fructose::test_root::get_test_name_abi_cxx11_(&local_10f8);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x701,(string *)&local_10f8,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncAddDeviceNotificationReqEx(port, &server, 0, 0, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2ea);
  std::__cxx11::string::~string((string *)&local_10f8);
  lVar1 = AdsSyncAddDeviceNotificationReqEx
                    (local_20,(AmsAddr *)&server,0x4025,0x10000,
                     (AdsNotificationAttrib *)auStack_1068,NotifyCallback,local_106c,
                     &attrib.nMaxDelay);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1118);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x701,(string *)&local_1118,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4025, 0x10000, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2f0);
  std::__cxx11::string::~string((string *)&local_1118);
  lVar1 = AdsSyncAddDeviceNotificationReqEx
                    (local_20,(AmsAddr *)&server,0x4020,4,(AdsNotificationAttrib *)0x0,
                     NotifyCallback,local_106c,&attrib.nMaxDelay);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1138);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x741,(string *)&local_1138,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, nullptr, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2f5);
  std::__cxx11::string::~string((string *)&local_1138);
  lVar1 = AdsSyncAddDeviceNotificationReqEx
                    (local_20,(AmsAddr *)&server,0x4020,4,(AdsNotificationAttrib *)auStack_1068,
                     (_func_void_AmsAddr_ptr_AdsNotificationHeader_ptr_uint *)0x0,local_106c,
                     &attrib.nMaxDelay);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1158);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x741,(string *)&local_1158,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, nullptr, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2f8);
  std::__cxx11::string::~string((string *)&local_1158);
  lVar1 = AdsSyncAddDeviceNotificationReqEx
                    (local_20,(AmsAddr *)&server,0x4020,4,(AdsNotificationAttrib *)auStack_1068,
                     NotifyCallback,local_106c,(uint *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1178);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x741,(string *)&local_1178,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback, hUser, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2fb);
  std::__cxx11::string::~string((string *)&local_1178);
  lVar1 = AdsSyncDelDeviceNotificationReqEx(local_20,(AmsAddr *)&server,0xdeadbeef);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1198);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x752,(string *)&local_1198,
             "ADSERR_CLIENT_REMOVEHASH == AdsSyncDelDeviceNotificationReqEx(port, &server, 0xDEADBEEF)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2fe);
  std::__cxx11::string::~string((string *)&local_1198);
  for (local_106c = 0; local_106c < 0x400; local_106c = local_106c + 1) {
    fructose::test_root::set_assertion_tested((test_root *)this);
    lVar1 = AdsSyncAddDeviceNotificationReqEx
                      (local_20,(AmsAddr *)&server,0x4020,4,(AdsNotificationAttrib *)auStack_1068,
                       NotifyCallback,local_106c,notification + ((ulong)local_106c - 2));
    bVar3 = fructose::test_root::reverse_mode((test_root *)this);
    if ((lVar1 == 0) == bVar3) {
      poVar2 = std::operator<<((ostream *)&std::cout,"hUser");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_106c);
      std::operator<<(poVar2,"\n");
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      fructose::test_root::get_test_name_abi_cxx11_(&local_11b8);
      fructose::test_root::test_assert
                ((test_root *)this,bVar3,(string *)&local_11b8,
                 "0 == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback, hUser, &notification[hUser])"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x306);
      std::__cxx11::string::~string((string *)&local_11b8);
    }
  }
  local_11c4 = 100;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_11c0,&local_11c4);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_11c0);
  for (local_106c = 0; local_106c < 0x200; local_106c = local_106c + 1) {
    fructose::test_root::set_assertion_tested((test_root *)this);
    lVar1 = AdsSyncDelDeviceNotificationReqEx
                      (local_20,(AmsAddr *)&server,notification[(ulong)local_106c - 2]);
    bVar3 = fructose::test_root::reverse_mode((test_root *)this);
    if ((lVar1 == 0) == bVar3) {
      poVar2 = std::operator<<((ostream *)&std::cout,"hUser");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_106c);
      std::operator<<(poVar2,"\n");
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      fructose::test_root::get_test_name_abi_cxx11_(&local_11e8);
      fructose::test_root::test_assert
                ((test_root *)this,bVar3,(string *)&local_11e8,
                 "0 == AdsSyncDelDeviceNotificationReqEx(port, &server, notification[hUser])",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x30a);
      std::__cxx11::string::~string((string *)&local_11e8);
    }
  }
  lVar1 = AdsPortCloseEx(local_20);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1208);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_1208,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x30c);
  std::__cxx11::string::~string((string *)&local_1208);
  return;
}

Assistant:

void testAdsNotification(const std::string&)
    {
        const long port = AdsPortOpenEx();

        fructose_assert(0 != port);

        static const size_t MAX_NOTIFICATIONS_PER_PORT = 1024;
        static const size_t LEAKED_NOTIFICATIONS = MAX_NOTIFICATIONS_PER_PORT / 2;
        uint32_t notification[MAX_NOTIFICATIONS_PER_PORT];
        AdsNotificationAttrib attrib = { 1, ADSTRANS_SERVERCYCLE, 0, {1000000} };
        uint32_t hUser = 0xDEADBEEF;

        // provide out of range port
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN ==
                        AdsSyncAddDeviceNotificationReqEx(0, &server, 0x4020, 0, &attrib, &NotifyCallback, hUser,
                                                          &notification[0]));

        // provide nullptr to AmsAddr
        fructose_assert(ADSERR_CLIENT_NOAMSADDR ==
                        AdsSyncAddDeviceNotificationReqEx(port, nullptr, 0x4020, 0, &attrib, &NotifyCallback, hUser,
                                                          &notification[0]));

        // provide unknown AmsAddr
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE ==
                        AdsSyncAddDeviceNotificationReqEx(port, &unknown, 0x4020, 0, &attrib, &NotifyCallback, hUser,
                                                          &notification[0]));

        // provide invalid indexGroup
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0, 0, &attrib, &NotifyCallback, hUser,
                                                          &notification[0]));

        // provide invalid indexOffset
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4025, 0x10000, &attrib, &NotifyCallback,
                                                          hUser,
                                                          &notification[0]));

        // provide nullptr to attrib/callback/hNotification
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, nullptr, &NotifyCallback, hUser,
                                                          &notification[0]));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, nullptr, hUser,
                                                          &notification[0]));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback, hUser,
                                                          nullptr));

        // delete nonexisting notification
        fructose_assert(ADSERR_CLIENT_REMOVEHASH == AdsSyncDelDeviceNotificationReqEx(port, &server, 0xDEADBEEF));

        // normal test
        for (hUser = 0; hUser < MAX_NOTIFICATIONS_PER_PORT; ++hUser) {
            fructose_loop_assert(hUser,
                                 0 ==
                                 AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback,
                                                                   hUser,
                                                                   &notification[hUser]));
        }
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
        for (hUser = 0; hUser < MAX_NOTIFICATIONS_PER_PORT - LEAKED_NOTIFICATIONS; ++hUser) {
            fructose_loop_assert(hUser, 0 == AdsSyncDelDeviceNotificationReqEx(port, &server, notification[hUser]));
        }
        fructose_assert(0 == AdsPortCloseEx(port));
    }